

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend.cpp
# Opt level: O3

void ggml_backend_sched_set_tensor_backend
               (ggml_backend_sched_t sched,ggml_tensor *node,ggml_backend_t backend)

{
  int iVar1;
  int *piVar2;
  size_t sVar3;
  long lVar4;
  
  iVar1 = sched->n_backends;
  if (0 < (long)iVar1) {
    lVar4 = 0;
    do {
      if (sched->backends[lVar4] == backend) {
        if ((int)lVar4 < iVar1) {
          piVar2 = sched->hv_tensor_backend_ids;
          sVar3 = ggml_hash_find_or_insert(&sched->hash_set,node);
          piVar2[sVar3] = (int)lVar4;
          sched->is_reset = false;
          return;
        }
        break;
      }
      lVar4 = lVar4 + 1;
    } while (iVar1 != lVar4);
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-backend.cpp"
             ,0x65e,"GGML_ASSERT(%s) failed",
             "backend_index >= 0 && backend_index < sched->n_backends");
}

Assistant:

void ggml_backend_sched_set_tensor_backend(ggml_backend_sched_t sched, struct ggml_tensor * node, ggml_backend_t backend) {
    int backend_index = ggml_backend_sched_backend_id(sched, backend);
    GGML_ASSERT(backend_index >= 0 && backend_index < sched->n_backends);
    tensor_backend_id(node) = backend_index;
    SET_CAUSE(node, "usr");
    sched->is_reset = false;
}